

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderConstantVariables.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderConstantVariables::iterate(GeometryShaderConstantVariables *this)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  undefined **ppuVar11;
  GLint int_value;
  GLint n_max_geometry_uniform_components;
  GLint n_max_geometry_uniform_blocks;
  GLint constant_values [9];
  GLint n_max_geometry_uniform_block_size;
  GLenum local_1ec;
  int local_1e8;
  int local_1e4;
  long local_1e0;
  int local_1d8 [2];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  int local_1b4;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar5;
  
  initTest(this);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind a vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc0);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind a buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc3);
  lVar9 = 0;
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object to transform feedback binding point.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc6);
  (**(code **)(lVar5 + 0x1680))(this->m_program_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xca);
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  (**(code **)(lVar5 + 0x30))(0);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  (**(code **)(lVar5 + 0x638))();
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Rendering failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xd4);
  (**(code **)(lVar5 + 0x4e8))(0x8c89);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  uStack_1d0 = 0;
  local_1b8 = 0;
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,local_1d8);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xdf);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS,local_1d8 + 1);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xe3);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,&uStack_1d0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xe7);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
             (long)&uStack_1d0 + 4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xeb);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,
             &local_1c8);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xef);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,
             (long)&local_1c8 + 4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xf3);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,&uStack_1c0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xf7);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
             (long)&uStack_1c0 + 4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xfb);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS,&local_1b8);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xff);
  lVar6 = (**(code **)(lVar5 + 0xd00))(0x8c8e,0,0x24,1);
  local_1e0 = lVar5;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"Could not map buffer object storage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x104);
  ppuVar11 = &m_feedbackVaryings;
  bVar10 = false;
  do {
    if (local_1d8[lVar9] != *(int *)(lVar6 + lVar9 * 4)) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Values reported for ES constant ",0x20);
      pcVar8 = *ppuVar11;
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
      }
      else {
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," in a shader: ",0xe)
      ;
      std::ostream::operator<<((ostringstream *)&local_1a8,*(int *)(lVar6 + lVar9 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," and via a glGetIntegerv() call: ",0x21);
      std::ostream::operator<<((ostringstream *)&local_1a8,local_1d8[lVar9]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," do not match.",0xe)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar10 = true;
    }
    lVar5 = local_1e0;
    lVar9 = lVar9 + 1;
    ppuVar11 = ppuVar11 + 1;
  } while (lVar9 != 9);
  (**(code **)(local_1e0 + 0x1670))(0x8c8e);
  local_1ec = 0;
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,&local_1ec
            );
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x120);
  if ((int)local_1ec < this->m_min_MaxGeometryAtomicCounterBuffers) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT constant value ",0x43);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<
              ((ostringstream *)&local_1a8,this->m_min_MaxGeometryAtomicCounterBuffers);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x12e);
  if ((int)local_1ec < this->m_min_MaxGeometryAtomicCounters) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT constant value ",
               0x3c);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryAtomicCounters);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x13c);
  if ((int)local_1ec < this->m_min_MaxGeometryImagesUniforms) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT constant value ",
               0x3b);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryImagesUniforms);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x149);
  if ((int)local_1ec < this->m_min_MaxGeometryTextureImagesUnits) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT constant value ",0x40);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryTextureImagesUnits);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,&local_1ec)
  ;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x158);
  if ((int)local_1ec < this->m_min_MaxGeometryShaderStorageBlocks) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT constant value ",0x42);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryShaderStorageBlocks)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x166);
  if ((int)local_1ec < this->m_min_MaxGeometryUniformComponents) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value ",0x3f);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryUniformComponents);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x174);
  if ((int)local_1ec < this->m_min_MaxGeometryUniformBlocks) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT constant value ",
               0x3b);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryUniformBlocks);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x181);
  if ((int)local_1ec < this->m_min_MaxGeometryInputComponents) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT constant value "
               ,0x3d);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryInputComponents);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x18e);
  if ((int)local_1ec < this->m_min_MaxGeometryOutputComponents) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT constant value ",0x3e);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryOutputComponents);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x19b);
  if ((int)local_1ec < this->m_min_MaxGeometryOutputVertices) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT constant value ",
               0x3c);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryOutputVertices);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,
             &local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1a8);
  if ((int)local_1ec < this->m_min_MaxGeometryTotalOutputComponents) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT constant value ",0x44);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<
              ((ostringstream *)&local_1a8,this->m_min_MaxGeometryTotalOutputComponents);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1b6);
  if ((int)local_1ec < this->m_min_MaxGeometryShaderInvocations) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT constant value ",0x3f);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxGeometryShaderInvocations);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_FRAMEBUFFER_LAYERS,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_FRAMEBUFFER_LAYERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1c3);
  if ((int)local_1ec < this->m_min_MaxFramebufferLayers) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_MAX_FRAMEBUFFER_LAYERS_EXT constant value ",0x36);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,this->m_min_MaxFramebufferLayers);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  lVar5 = local_1e0;
  local_1e4 = 0;
  local_1b4 = 0;
  local_1e8 = 0;
  (**(code **)(local_1e0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1d5);
  (**(code **)(lVar5 + 0x868))(0x8a30,&local_1b4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_UNIFORM_BLOCK_SIZE.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1d9);
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,&local_1e8);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1dd);
  iVar3 = local_1b4 * local_1e4;
  iVar1 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  iVar1 = (iVar1 >> 2) + local_1e8;
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS,
             &local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,
                  "glGetIntegerv() failed for GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1e5);
  if ((int)local_1ec < iVar1) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Reported GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value ",0x48);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is smaller than required minimum value of ",0x2b);
    std::ostream::operator<<((ostringstream *)&local_1a8,iVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.LAYER_PROVOKING_VERTEX,&local_1ec);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,500);
  uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (((((uVar4 & 0x300) != 0) && (local_1ec != 0x8e4f)) &&
      (local_1ec != (this->super_TestCaseBase).m_glExtTokens.FIRST_VERTEX_CONVENTION)) &&
     ((local_1ec != (this->super_TestCaseBase).m_glExtTokens.LAST_VERTEX_CONVENTION &&
      (local_1ec != (this->super_TestCaseBase).m_glExtTokens.UNDEFINED_VERTEX)))) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Reported GL_LAYER_PROVOKING_VERTEX_EXT constant value ",0x36);
    std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," is not among permissible values",0x20);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = true;
  }
  if (!bVar10) {
    pcVar8 = "Pass";
  }
  else {
    pcVar8 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar10,pcVar8)
  ;
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderConstantVariables::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up relevant bindings */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a vertex array object");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a buffer object!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object to transform feedback binding point.");

	/* Prepare for rendering. */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.enable(GL_RASTERIZER_DISCARD);

	gl.beginTransformFeedback(GL_POINTS);
	{
		/* Render */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed.");

	gl.disable(GL_RASTERIZER_DISCARD);

	/* First, retrieve the ES constant values using the API. */
	const unsigned int n_varyings				   = sizeof(m_feedbackVaryings) / sizeof(m_feedbackVaryings[0]);
	glw::GLint		   constant_values[n_varyings] = { 0 };
	unsigned int	   index					   = 0;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT failed.");

	const glw::GLint* stored_data_ptr = (const glw::GLint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(glw::GLint) * n_varyings, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object storage");

	/* Compare the values that were stored by the draw call with values
	 * returned by the getter call.
	 */
	bool has_failed = false;
	for (unsigned int id = 0; id < n_varyings; ++id)
	{
		if (constant_values[id] != stored_data_ptr[id])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for ES constant " << m_feedbackVaryings[id]
							   << " in a shader: " << stored_data_ptr[id]
							   << " and via a glGetIntegerv() call: " << constant_values[id] << " do not match."
							   << tcu::TestLog::EndMessage;
			has_failed = true;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	/* Check whether the reported values are at least of the minimum value described in relevant
	 * extension specifications */

	glw::GLint int_value = 0;

	/* Check values of ES constants specific to shader atomic counters */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT");

	if (int_value < m_min_MaxGeometryAtomicCounterBuffers)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryAtomicCounterBuffers
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT");

	if (int_value < m_min_MaxGeometryAtomicCounters)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryAtomicCounters << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check values of ES constants specific to image load store */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT");

	if (int_value < m_min_MaxGeometryImagesUniforms)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryImagesUniforms << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT");

	if (int_value < m_min_MaxGeometryTextureImagesUnits)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryTextureImagesUnits
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check values of ES constants specific to shader storage buffer objects */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT");

	if (int_value < m_min_MaxGeometryShaderStorageBlocks)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryShaderStorageBlocks
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryUniformComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryUniformComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check EXT_geometry_shader specific constant values */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT");

	if (int_value < m_min_MaxGeometryUniformBlocks)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryUniformBlocks << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryInputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryInputComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryOutputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryOutputComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT");

	if (int_value < m_min_MaxGeometryOutputVertices)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryOutputVertices << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryTotalOutputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryTotalOutputComponents
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT");

	if (int_value < m_min_MaxGeometryShaderInvocations)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryShaderInvocations << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_FRAMEBUFFER_LAYERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_FRAMEBUFFER_LAYERS_EXT");

	if (int_value < m_min_MaxFramebufferLayers)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_FRAMEBUFFER_LAYERS_EXT constant value "
						   << int_value << " is smaller than required minimum value of " << m_min_MaxFramebufferLayers
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Compute minimum value that is acceptable for gl_MaxCombinedGeometryUniformComponents */
	glw::GLint n_max_geometry_uniform_blocks	 = 0;
	glw::GLint n_max_geometry_uniform_block_size = 0;
	glw::GLint n_max_geometry_uniform_components = 0;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &n_max_geometry_uniform_blocks);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT.");

	gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &n_max_geometry_uniform_block_size);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_UNIFORM_BLOCK_SIZE.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &n_max_geometry_uniform_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT.");

	glw::GLint n_max_combined_geometry_uniform_components =
		n_max_geometry_uniform_blocks * n_max_geometry_uniform_block_size / 4 + n_max_geometry_uniform_components;

	/* Compare against actual constant value */
	gl.getIntegerv(m_glExtTokens.MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT.");

	if (int_value < n_max_combined_geometry_uniform_components)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value " << int_value
						   << " is smaller than required minimum value of "
						   << n_max_combined_geometry_uniform_components << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Make sure value reported for GL_LAYER_PROVOKING_VERTEX_EXT is valid */
	gl.getIntegerv(m_glExtTokens.LAYER_PROVOKING_VERTEX, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT.");

	if (
		/* This value is allowed in Desktop OpenGL, but not in the ES 3.1 extension. */
		(!glu::isContextTypeES(m_context.getRenderContext().getType()) &&
		 (glw::GLenum)int_value != GL_PROVOKING_VERTEX) &&
		(glw::GLenum)int_value != m_glExtTokens.FIRST_VERTEX_CONVENTION &&
		(glw::GLenum)int_value != m_glExtTokens.LAST_VERTEX_CONVENTION &&
		(glw::GLenum)int_value != m_glExtTokens.UNDEFINED_VERTEX)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_LAYER_PROVOKING_VERTEX_EXT constant value "
						   << int_value << " is not among permissible values" << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	if (has_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}